

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queens-seq.c
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  __syscall_slong_t _Var2;
  uint n;
  int extraout_EAX;
  long lVar3;
  code *pcStack_40;
  undefined1 local_38 [8];
  timespec tv;
  
  if (argc != 1) {
    pcStack_40 = (code *)0x10132d;
    n = atoi(argv[1]);
    lVar1 = -((long)(int)n + 0xfU & 0xfffffffffffffff0);
    *(undefined8 *)((long)&pcStack_40 + lVar1) = 0x101351;
    printf("running queens %d sequentially...\n",(ulong)n);
    *(undefined8 *)((long)&pcStack_40 + lVar1) = 0x101362;
    clock_gettime(1,(timespec *)local_38);
    tv.tv_nsec = (__syscall_slong_t)((double)tv.tv_sec * 1e-09 + (double)(long)local_38);
    *(undefined8 *)((long)&pcStack_40 + lVar1) = 0x10138a;
    lVar3 = nqueens(n,0,local_38 + lVar1);
    *(undefined8 *)((long)&pcStack_40 + lVar1) = 0x10139a;
    clock_gettime(1,(timespec *)local_38);
    tv.tv_nsec = (__syscall_slong_t)
                 (((double)tv.tv_sec * 1e-09 + (double)(long)local_38) - (double)tv.tv_nsec);
    *(undefined8 *)((long)&pcStack_40 + lVar1) = 0x1013d4;
    printf("Result: Q(%d) = %ld\n",(ulong)n,lVar3);
    _Var2 = tv.tv_nsec;
    *(undefined8 *)((long)&pcStack_40 + lVar1) = 0x1013e7;
    printf("Time: %f\n",_Var2);
    return 0;
  }
  pcStack_40 = _fini;
  main_cold_1();
  return extraout_EAX;
}

Assistant:

int main(int argc, char *argv[])
{
    if (1 == argc) {
        usage(argv[0]);
        exit(1);
    }

    int n = atoi(argv[1]);

    char *a = (char*)alloca(n*sizeof(char));

    printf("running queens %d sequentially...\n", n);

    double t1 = wctime();
    long res = nqueens(n, 0, a);
    double t2 = wctime();

    printf("Result: Q(%d) = %ld\n", n, res);

    printf("Time: %f\n", t2-t1);

    return 0;
}